

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManFilterEquivsUsingLatches
               (Gia_Man_t *pGia,int fFlopsOnly,int fFlopsWith,int fUseRiDrivers)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Rpr_t GVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  bool bVar10;
  int iVar11;
  Vec_Int_t *p;
  int *piVar12;
  void *__s;
  long lVar13;
  uint *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  Gia_Rpr_t *pGVar19;
  uint uVar20;
  
  if (fFlopsOnly == fFlopsWith) {
    __assert_fail("fFlopsOnly ^ fFlopsWith",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                  ,0x869,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar12 = (int *)malloc(400);
  p->pArray = piVar12;
  iVar2 = pGia->nObjs;
  iVar11 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar11 = iVar2;
  }
  if (iVar11 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar11 << 2);
  }
  memset(__s,0,(long)iVar2 * 4);
  iVar11 = pGia->nRegs;
  if (fUseRiDrivers == 0) {
    if (0 < iVar11) {
      pVVar8 = pGia->vCis;
      iVar3 = pVVar8->nSize;
      iVar11 = -iVar11;
      do {
        uVar20 = iVar3 + iVar11;
        if (((int)uVar20 < 0) || (iVar3 <= (int)uVar20)) goto LAB_00699fb5;
        iVar4 = pVVar8->pArray[uVar20];
        if (((long)iVar4 < 0) || (iVar2 <= iVar4)) goto LAB_00699ff3;
        if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
        *(undefined4 *)((long)__s + (long)iVar4 * 4) = 1;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 0);
    }
  }
  else if (0 < iVar11) {
    pVVar8 = pGia->vCos;
    iVar3 = pVVar8->nSize;
    iVar11 = -iVar11;
    do {
      uVar20 = iVar3 + iVar11;
      if (((int)uVar20 < 0) || (iVar3 <= (int)uVar20)) goto LAB_00699fb5;
      iVar4 = pVVar8->pArray[uVar20];
      if (((long)iVar4 < 0) || (iVar2 <= iVar4)) {
LAB_00699ff3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      uVar20 = iVar4 - (*(uint *)(pGia->pObjs + iVar4) & 0x1fffffff);
      if (((int)uVar20 < 0) || (iVar2 <= (int)uVar20)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar20 * 4) = 1;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0);
  }
  uVar18 = 0;
  uVar20 = 0;
  iVar11 = iVar2;
  if (1 < iVar2) {
    uVar20 = 0;
    lVar13 = 1;
    uVar18 = 0;
    do {
      GVar5 = pGia->pReprs[lVar13];
      if (((uint)GVar5 & 0xfffffff) == 0) {
        if (pGia->pNexts[lVar13] != 0) {
          __assert_fail("pGia->pNexts[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                        ,0x87b,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        if (iVar2 <= lVar13) {
LAB_00699fb5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar18 = uVar18 + 1;
        if (*(int *)((long)__s + lVar13 * 4) == 0) {
          pGia->pReprs[lVar13] = (Gia_Rpr_t)((uint)GVar5 | 0xfffffff);
          iVar11 = pGia->nObjs;
        }
        else {
          uVar20 = uVar20 + 1;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar11);
  }
  if (fFlopsOnly == 0) {
    if (1 < iVar11) {
      pGVar19 = pGia->pReprs;
      uVar17 = 1;
      do {
        if (((~(uint)pGVar19[uVar17] & 0xfffffff) == 0) &&
           (piVar9 = pGia->pNexts, 0 < piVar9[uVar17])) {
          puVar14 = (uint *)(piVar9 + uVar17);
          uVar18 = uVar18 - 1;
          bVar10 = false;
          uVar15 = uVar17 & 0xffffffff;
          uVar6 = uVar20 - 1;
          uVar16 = uVar20;
          do {
            uVar16 = uVar16 + 1;
            if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_00699fb5;
            if (*(int *)((long)__s + uVar15 * 4) != 0) {
              bVar10 = true;
            }
            puVar1 = (uint *)(piVar9 + uVar15);
            uVar15 = (ulong)*puVar1;
            uVar20 = uVar6 + 1;
            uVar18 = uVar18 + 1;
            uVar6 = uVar20;
          } while (*puVar1 != 0);
          if (!bVar10) {
            uVar15 = uVar17 & 0xffffffff;
            uVar20 = uVar16;
            do {
              uVar6 = *puVar14;
              pGia->pReprs[(int)uVar15] = (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar15] | 0xfffffff);
              uVar20 = uVar20 - 1;
              piVar9 = pGia->pNexts;
              piVar9[(int)uVar15] = 0;
              puVar14 = (uint *)(piVar9 + (int)uVar6);
              uVar15 = (ulong)uVar6;
            } while ((long)(int)uVar6 != 0);
            pGVar19 = pGia->pReprs;
            if (((~(uint)pGVar19[uVar17] & 0xfffffff) == 0) && (0 < piVar9[uVar17])) {
              __assert_fail("!Gia_ObjIsHead(pGia, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                            ,0x8be,
                            "void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
            }
            iVar11 = pGia->nObjs;
          }
        }
        uVar17 = uVar17 + 1;
      } while ((long)uVar17 < (long)iVar11);
    }
  }
  else if (1 < iVar11) {
    uVar17 = 1;
    do {
      if (((~(uint)pGia->pReprs[uVar17] & 0xfffffff) == 0) &&
         (piVar12 = pGia->pNexts, 0 < piVar12[uVar17])) {
        p->nSize = 0;
        uVar18 = uVar18 - 1;
        uVar15 = uVar17 & 0xffffffff;
        do {
          iVar11 = (int)uVar15;
          if ((iVar11 < 0) || (iVar2 <= iVar11)) goto LAB_00699fb5;
          if (*(int *)((long)__s + uVar15 * 4) != 0) {
            Vec_IntPush(p,iVar11);
            piVar12 = pGia->pNexts;
          }
          puVar14 = (uint *)(piVar12 + uVar15);
          uVar15 = (ulong)*puVar14;
          uVar18 = uVar18 + 1;
        } while (*puVar14 != 0);
        puVar14 = (uint *)(piVar12 + uVar17);
        uVar15 = uVar17 & 0xffffffff;
        do {
          uVar6 = *puVar14;
          pGia->pReprs[(int)uVar15] = (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar15] | 0xfffffff);
          piVar12 = pGia->pNexts;
          piVar12[(int)uVar15] = 0;
          puVar14 = (uint *)(piVar12 + (int)uVar6);
          uVar15 = (ulong)uVar6;
        } while ((long)(int)uVar6 != 0);
        if (((~(uint)pGia->pReprs[uVar17] & 0xfffffff) == 0) && (0 < piVar12[uVar17])) {
          __assert_fail("!Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                        ,0x895,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        iVar11 = p->nSize;
        if (1 < (long)iVar11) {
          puVar14 = (uint *)p->pArray;
          uVar6 = *puVar14;
          uVar20 = (uVar20 + iVar11) - 1;
          lVar13 = 1;
          uVar16 = uVar6;
          do {
            uVar7 = puVar14[lVar13];
            if ((uVar6 != 0xfffffff) && ((int)uVar7 <= (int)uVar6)) {
              __assert_fail("Num == GIA_VOID || Num < Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x38c,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
            }
            pGia->pReprs[(int)uVar7] =
                 (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar7] & 0xf0000000 | uVar6 & 0xfffffff);
            piVar12 = pGia->pNexts;
            piVar12[(int)uVar16] = uVar7;
            lVar13 = lVar13 + 1;
            uVar16 = uVar7;
          } while (iVar11 != lVar13);
          if (piVar12[(int)uVar7] != 0) {
            __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                          ,0x8a1,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)pGia->nObjs);
    piVar12 = p->pArray;
  }
  if (piVar12 != (int *)0x0) {
    free(piVar12);
  }
  free(p);
  if (__s != (void *)0x0) {
    free(__s);
  }
  Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)uVar18,(ulong)uVar20);
  return;
}

Assistant:

void Gia_ManFilterEquivsUsingLatches( Gia_Man_t * pGia, int fFlopsOnly, int fFlopsWith, int fUseRiDrivers )
{
    Gia_Obj_t * pObjR;
    Vec_Int_t * vNodes, * vFfIds;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld = 0, iLitsNew = 0;
    assert( fFlopsOnly ^ fFlopsWith );
    vNodes = Vec_IntAlloc( 100 );
    // select nodes "flop" node IDs
    vFfIds = Vec_IntStart( Gia_ManObjNum(pGia) );
    if ( fUseRiDrivers )
    {
        Gia_ManForEachRi( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjFaninId0p(pGia, pObjR), 1 );
    }
    else
    {
        Gia_ManForEachRo( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjId(pGia, pObjR), 1 );
    }
    // remove all non-flop constants
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        assert( pGia->pNexts[i] == 0 );
        if ( !Vec_IntEntry(vFfIds, i) )
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // clear the classes
    if ( fFlopsOnly )
    {
        Gia_ManForEachClass( pGia, i )
        {
            Vec_IntClear( vNodes );
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    Vec_IntPush( vNodes, iObj );
                iLitsOld++;
            }
            iLitsOld--;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
            }
            assert( !Gia_ObjIsHead(pGia, i) );
            if ( Vec_IntSize(vNodes) > 1 )
            {
                // create new class
                iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
                Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
                {
                    Gia_ObjSetRepr( pGia, iObj, iRepr );
                    Gia_ObjSetNext( pGia, iPrev, iObj );
                    iPrev = iObj;
                    iLitsNew++;
                }
                assert( Gia_ObjNext(pGia, iPrev) == 0 );
            }
        }
    }
    else
    {
        Gia_ManForEachClass( pGia, i )
        {
            int fSeenFlop = 0;
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    fSeenFlop = 1;
                iLitsOld++;
                iLitsNew++;
            }
            iLitsOld--;
            iLitsNew--;
            if ( fSeenFlop )
                continue;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
                iLitsNew--;
            }
            iLitsNew++;
            assert( !Gia_ObjIsHead(pGia, i) );
        }
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFfIds );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
}